

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

Data<8U> * read_standard_data<8u>(char *PATH,int interval,int *cnt)

{
  undefined1 auVar1 [32];
  int iVar2;
  undefined8 *__addr;
  Data<8U> *pDVar3;
  long lVar4;
  char *__s;
  ulong uVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  stat buf;
  stat local_c0;
  undefined1 auVar8 [32];
  
  iVar2 = open(PATH,0);
  fstat(iVar2,&local_c0);
  *cnt = (int)(local_c0.st_size / (long)interval);
  __addr = (undefined8 *)mmap((void *)0x0,local_c0.st_size,1,2,iVar2,0);
  close(iVar2);
  if (__addr == (undefined8 *)0xffffffffffffffff) {
    __s = "[ERROR] MMAP FAILED!";
  }
  else {
    iVar2 = *cnt;
    pDVar3 = (Data<8U> *)malloc((ulong)(uint)(iVar2 * 8));
    if (pDVar3 != (Data<8U> *)0x0) {
      if (0 < iVar2) {
        auVar6 = vpbroadcastq_avx512vl();
        auVar7 = vpbroadcastq_avx512vl();
        auVar1 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        lVar4 = 0;
        auVar10._8_8_ = 4;
        auVar10._0_8_ = 4;
        auVar10._16_8_ = 4;
        auVar10._24_8_ = 4;
        do {
          uVar5 = vpcmpuq_avx512vl(auVar1,auVar6,2);
          uVar5 = uVar5 & 0xf;
          vpmullq_avx512vl(auVar1,auVar7);
          auVar8 = vpgatherqq_avx512vl(*__addr);
          auVar9._8_8_ = (ulong)((byte)(uVar5 >> 1) & 1) * auVar8._8_8_;
          auVar9._0_8_ = (ulong)((byte)uVar5 & 1) * auVar8._0_8_;
          auVar9._16_8_ = (ulong)((byte)(uVar5 >> 2) & 1) * auVar8._16_8_;
          auVar9._24_8_ = (uVar5 >> 3) * auVar8._24_8_;
          auVar8 = vmovdqu64_avx512vl(auVar9);
          *(undefined1 (*) [32])(pDVar3->str + lVar4) = auVar8;
          auVar1 = vpaddq_avx2(auVar1,auVar10);
          lVar4 = lVar4 + 0x20;
        } while ((ulong)(iVar2 + 3U >> 2) << 5 != lVar4);
      }
      munmap(__addr,local_c0.st_size);
      return pDVar3;
    }
    __s = "[ERROR] MALLOC FAILED!";
  }
  puts(__s);
  exit(-1);
}

Assistant:

Data<DATA_LEN>* read_standard_data(const char* PATH, int interval, int* cnt) {
	struct stat buf;
	// printf("Opening file...\n");
	int fd = open(PATH, O_RDONLY);
	fstat(fd, &buf);

	*cnt = buf.st_size / interval;
	uint8_t* raw_addr = (uint8_t*)mmap(NULL, buf.st_size, PROT_READ, MAP_PRIVATE, fd, 0);
	close(fd);
	if (raw_addr == MAP_FAILED) {
		printf("[ERROR] MMAP FAILED!\n");
		exit(-1);
	}

	int num = *cnt;
	void* raw_data = malloc(DATA_LEN * num);
	if (raw_data == NULL) {
		printf("[ERROR] MALLOC FAILED!\n");
		exit(-1);
	}

	Data<DATA_LEN>* data = reinterpret_cast<Data<DATA_LEN>*>(raw_data);
	for (int i = 0; i < num; i++)
		data[i] = *reinterpret_cast<Data<DATA_LEN>*>(raw_addr + interval * i);
	munmap(raw_addr, buf.st_size);
	return data;
}